

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov7_pnnx.cpp
# Opt level: O2

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int j;
  ulong uVar10;
  float *pfVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int i;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long local_110;
  value_type local_a0;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  double dStack_60;
  float local_58;
  float local_48;
  
  uVar15 = (long)anchors->w / 2;
  local_88 = (float)stride;
  uVar9 = 0;
  uVar12 = (ulong)(uint)in_pad->w;
  if (in_pad->w < 1) {
    uVar12 = uVar9;
  }
  uVar13 = (ulong)(uint)in_pad->h;
  if (in_pad->h < 1) {
    uVar13 = uVar9;
  }
  uVar6 = uVar15 & 0xffffffff;
  if ((int)uVar15 < 1) {
    uVar6 = uVar9;
  }
  local_110 = 5;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    lVar7 = uVar9 * 0x55;
    uVar1 = *(undefined8 *)((long)anchors->data + uVar9 * 8);
    dVar4 = (double)(float)uVar1;
    uVar21 = (undefined4)((ulong)dVar4 >> 0x20);
    dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
    local_78._8_4_ = SUB84(dVar5,0);
    local_78._0_8_ = dVar4;
    local_78._12_4_ = (int)((ulong)dVar5 >> 0x20);
    for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
      local_68 = (float)(int)uVar15;
      lVar16 = 0;
      uStack_64 = uVar21;
      dStack_60 = dVar5;
      for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
        sVar2 = in_pad->elemsize;
        sVar3 = in_pad->cstep;
        lVar8 = (long)in_pad->w * uVar15;
        pfVar11 = (float *)((long)in_pad->data + lVar16 + (local_110 * sVar3 + lVar8) * sVar2);
        fVar24 = -3.4028235e+38;
        uVar17 = 0;
        for (uVar14 = 0; uVar14 != 0x50; uVar14 = uVar14 + 1) {
          if (fVar24 < *pfVar11) {
            uVar17 = uVar14 & 0xffffffff;
            fVar24 = *pfVar11;
          }
          pfVar11 = (float *)((long)pfVar11 + sVar3 * sVar2);
        }
        fVar18 = sigmoid(*(float *)((long)in_pad->data +
                                   uVar10 * 4 + sVar3 * (lVar7 + 4) * sVar2 + lVar8 * sVar2));
        fVar24 = sigmoid(fVar24);
        uVar21 = extraout_XMM0_Db;
        uVar22 = extraout_XMM0_Dc;
        uVar23 = extraout_XMM0_Dd;
        if (0.25 <= fVar24 * fVar18) {
          fVar19 = sigmoid(*(float *)((long)in_pad->data +
                                     uVar10 * 4 +
                                     (long)in_pad->w * uVar15 * in_pad->elemsize +
                                     in_pad->cstep * lVar7 * in_pad->elemsize));
          local_48 = sigmoid(*(float *)((long)in_pad->data +
                                       uVar10 * 4 +
                                       (long)in_pad->w * uVar15 * in_pad->elemsize +
                                       in_pad->cstep * (lVar7 + 1) * in_pad->elemsize));
          local_58 = sigmoid(*(float *)((long)in_pad->data +
                                       uVar10 * 4 +
                                       (long)in_pad->w * uVar15 * in_pad->elemsize +
                                       in_pad->cstep * (lVar7 + 2) * in_pad->elemsize));
          fVar20 = sigmoid(*(float *)((long)in_pad->data +
                                     uVar10 * 4 +
                                     (long)in_pad->w * uVar15 * in_pad->elemsize +
                                     in_pad->cstep * (lVar7 + 3) * in_pad->elemsize));
          fVar25 = (fVar19 + fVar19 + -0.5 + (float)(int)uVar10) * local_88;
          fVar26 = (local_48 + local_48 + -0.5 + local_68) * fStack_84;
          fVar19 = (float)((double)(local_58 + local_58) * (double)(local_58 + local_58) *
                          (double)local_78._0_8_) * 0.5;
          fVar20 = (float)((double)(fVar20 + fVar20) * (double)(fVar20 + fVar20) *
                          (double)local_78._8_8_) * 0.5;
          local_a0.rect.x = fVar25 - fVar19;
          local_a0.rect.y = fVar26 - fVar20;
          local_a0.rect.width = (fVar19 + fVar25) - local_a0.rect.x;
          local_a0.rect.height = (fVar20 + fVar26) - local_a0.rect.y;
          local_a0.label = (int)uVar17;
          local_a0.prob = fVar24 * fVar18;
          std::vector<Object,_std::allocator<Object>_>::push_back
                    ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_a0);
          uVar21 = extraout_XMM0_Db_00;
          uVar22 = extraout_XMM0_Dc_00;
          uVar23 = extraout_XMM0_Dd_00;
        }
        dVar5 = (double)CONCAT44(uVar23,uVar22);
        lVar16 = lVar16 + 4;
      }
    }
    local_110 = local_110 + 0x55;
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = 80;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * 85 + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * 85 + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * 85 + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * 85 + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * 85 + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * 85 + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}